

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfcc.hpp
# Opt level: O1

Mat_<double> * cvlinspace(Mat_<double> *__return_storage_ptr__,double min_,double max_,int length)

{
  long lVar1;
  ulong uVar2;
  
  cv::Mat::Mat(&__return_storage_ptr__->super_Mat,1,length,6);
  if (0 < length) {
    lVar1 = *(long *)&__return_storage_ptr__->field_0x10;
    uVar2 = 0;
    do {
      *(double *)(lVar1 + uVar2 * 8) =
           (double)(int)uVar2 * ((max_ - min_) / (double)(length + -1)) + min_;
      uVar2 = uVar2 + 1;
    } while ((uint)length != uVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

cv::Mat_<double> cvlinspace(double min_, double max_, int length) {
    auto cvmat = cv::Mat_<double>(1, length);
    for (int i = 0; i < length; i++) {
        cvmat(0, i) = ((max_ - min_) / (length - 1) * i) + min_;
    }
    return cvmat;
}